

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O1

int open_serialport(char *dev,int baudrate)

{
  int __fd;
  speed_t __speed;
  termios options;
  termios local_5c;
  
  __fd = open(dev,0x102);
  if (__fd == -1) {
    return -1;
  }
  if (baudrate < 0x70800) {
    if (baudrate < 0x9600) {
      if (baudrate == 600) {
        __speed = 8;
        goto LAB_00102a58;
      }
      if (baudrate == 0x4b0) {
        __speed = 9;
        goto LAB_00102a58;
      }
      if (baudrate == 0x4b00) {
        __speed = 0xe;
        goto LAB_00102a58;
      }
    }
    else if (baudrate < 0x1c200) {
      if (baudrate == 0x9600) {
        __speed = 0xf;
        goto LAB_00102a58;
      }
      if (baudrate == 0xe100) {
        __speed = 0x1001;
        goto LAB_00102a58;
      }
    }
    else {
      if (baudrate == 0x1c200) {
        __speed = 0x1002;
        goto LAB_00102a58;
      }
      if (baudrate == 0x38400) {
        __speed = 0x1003;
        goto LAB_00102a58;
      }
    }
  }
  else if (baudrate < 1500000) {
    if (baudrate != 0x70800) {
      if (baudrate == 0xe1000) {
        __speed = 0x1007;
        goto LAB_00102a58;
      }
      if (baudrate == 1000000) {
        __speed = 0x1008;
        goto LAB_00102a58;
      }
    }
  }
  else if (baudrate < 3000000) {
    if (baudrate == 1500000) {
      __speed = 0x100a;
      goto LAB_00102a58;
    }
    if (baudrate == 2000000) {
      __speed = 0x100b;
      goto LAB_00102a58;
    }
  }
  else {
    __speed = 0x100f;
    if (baudrate == 4000000) goto LAB_00102a58;
    if (baudrate == 3000000) {
      __speed = 0x100d;
      goto LAB_00102a58;
    }
  }
  __speed = 0x1004;
LAB_00102a58:
  if (((byte)loglevel & 8) != 0) {
    syslog(7,"serial opened\n");
  }
  tcgetattr(__fd,&local_5c);
  cfsetispeed(&local_5c,__speed);
  cfsetospeed(&local_5c,__speed);
  cfmakeraw(&local_5c);
  local_5c.c_cc[5] = '\x01';
  local_5c.c_cc[6] = '\0';
  tcsetattr(__fd,0,&local_5c);
  return __fd;
}

Assistant:

int open_serialport(const char *dev, int baudrate)
{
    int fd;

    fd = open(dev, O_RDWR | O_NOCTTY /*| O_NDELAY*/);
    if (fd != -1) {
        struct termios options;
        speed_t baud = tcio_baud(baudrate);
        LOGD("serial opened\n" );
        // The old way. Let's not change baud settings
        // fcntl(fd, F_SETFL, 0);

        // get the parameters
        tcgetattr(fd, &options);

        cfsetispeed(&options, baud);
        cfsetospeed(&options, baud);

        cfmakeraw(&options);

        //options.c_cflag |= (IXON | IXOFF);
        options.c_cc[VTIME] = 1;
        options.c_cc[VMIN]  = 0;

        // Set the new options for the port...
        tcsetattr(fd, TCSANOW, &options);
    }
    return fd;
}